

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-stairs.c
# Opt level: O1

_Bool borg_prep_leave_level_spells(void)

{
  wchar_t wVar1;
  _Bool _Var2;
  wchar_t wVar3;
  char *pcVar4;
  
  if ((borg.goal.fleeing) || (borg.trait[0x1e] < (borg.trait[0x1f] * 6) / 10)) {
    return false;
  }
  if ((!borg.temp.fast) && (_Var2 = borg_spell_fail(HASTE_SELF,L'\x0f'), _Var2)) {
    borg_note("# Casting speed spell before leaving level.");
    borg.no_rest_prep = 5000;
    return true;
  }
  if (((byte)(borg.temp.res_acid + borg.temp.res_fire + borg.temp.res_elec + borg.temp.res_cold) < 3
      ) && (_Var2 = borg_spell_fail(RESISTANCE,L'\x0f'), _Var2)) {
    pcVar4 = "# Casting Resistance spell before leaving level.";
LAB_0021fc58:
    borg_note(pcVar4);
    borg.no_rest_prep = 21000;
  }
  else {
    if ((borg.temp.fastcast == false) && (_Var2 = borg_spell_fail(MANA_CHANNEL,L'\x0f'), _Var2)) {
      pcVar4 = "# Casting Mana Channel spell before leaving level.";
    }
    else {
      if ((borg.temp.berserk == false) && (_Var2 = borg_spell_fail(BERSERK_STRENGTH,L'\x0f'), _Var2)
         ) {
        borg_note("# Casting Berserk Strength spell before leaving level.");
        borg.no_rest_prep = 10000;
        return true;
      }
      if (((borg.temp.hero == false) && (_Var2 = borg_spell_fail(HEROISM,L'\x0f'), _Var2)) &&
         (wVar1 = borg.trait[0x23], wVar3 = borg_heroism_level(), wVar3 < wVar1)) {
        borg_note("# Casting Heroism spell before leaving level.");
        borg.no_rest_prep = 3000;
        return true;
      }
      if ((borg.temp.regen != false) ||
         (_Var2 = borg_spell_fail(RAPID_REGENERATION,L'\x0f'), !_Var2)) {
        if ((borg.temp.smite_evil != false) ||
           ((borg.trait[0xc2] != 0 || (_Var2 = borg_spell_fail(SMITE_EVIL,L'\x0f'), !_Var2)))) {
          if ((borg.temp.venom == false) &&
             ((borg.trait[0xd1] == 0 && (_Var2 = borg_spell_fail(VENOM,L'\x0f'), _Var2)))) {
            borg_note("# Casting Venom before leaving level.");
            borg.no_rest_prep = 18000;
            return true;
          }
          if ((borg.temp.prot_from_evil == false) &&
             (_Var2 = borg_spell_fail(PROTECTION_FROM_EVIL,L'\x0f'), _Var2)) {
            borg_note("# Casting PFE before leaving level.");
            borg.no_rest_prep = (short)borg.trait[0x23] * 1000;
            return true;
          }
          if (borg.temp.bless != false) {
            return false;
          }
          _Var2 = borg_spell_fail(BLESS,L'\x0f');
          if ((!_Var2) && (_Var2 = borg_spell_fail(DEMON_BANE,L'\x0f'), !_Var2)) {
            return false;
          }
          borg_note("# Casting blessing before leaving level.");
          borg.no_rest_prep = 11000;
          return true;
        }
        pcVar4 = "# Casting Smite Evil before leaving level.";
        goto LAB_0021fc58;
      }
      pcVar4 = "# Casting Regen before leaving level.";
    }
    borg_note(pcVar4);
    borg.no_rest_prep = 6000;
  }
  return true;
}

Assistant:

bool borg_prep_leave_level_spells(void)
{
    /* if we are running away, just run. */
    if (borg.goal.fleeing)
        return false;

    /* if we are low on mana, don't prep. */
    if (borg.trait[BI_CURSP] < ((borg.trait[BI_MAXSP] * 6) / 10))
        return false;

    /* Cast haste */
    if (!borg.temp.fast && borg_spell_fail(HASTE_SELF, 15)) {
        borg_note("# Casting speed spell before leaving level.");
        borg.no_rest_prep = 5000;
        return true;
    }

    /* Cast resistance */
    if (borg.temp.res_fire + borg.temp.res_acid + borg.temp.res_elec
                + borg.temp.res_cold
            < 3
        && borg_spell_fail(RESISTANCE, 15)) {
        borg_note("# Casting Resistance spell before leaving level.");
        borg.no_rest_prep = 21000;
        return true;
    }

    /* Cast fastcast */
    if (!borg.temp.fastcast && borg_spell_fail(MANA_CHANNEL, 15)) {
        borg_note("# Casting Mana Channel spell before leaving level.");
        borg.no_rest_prep = 6000;
        return true;
    }

    /* Cast Berserk Strength */
    if (!borg.temp.berserk && borg_spell_fail(BERSERK_STRENGTH, 15)) {
        borg_note("# Casting Berserk Strength spell before leaving level.");
        borg.no_rest_prep = 10000;
        return true;
    }

    /* Cast heroism if above level it gives temp attribute */
    if (!borg.temp.hero && borg_spell_fail(HEROISM, 15)
        && borg.trait[BI_CLEVEL] > borg_heroism_level()) {
        borg_note("# Casting Heroism spell before leaving level.");
        borg.no_rest_prep = 3000;
        return true;
    }

    /* Cast regen just before returning to dungeon */
    if (!borg.temp.regen && borg_spell_fail(RAPID_REGENERATION, 15)) {
        borg_note("# Casting Regen before leaving level.");
        borg.no_rest_prep = 6000;
        return true;
    }

    /* Cast Smite Evil just before returning to dungeon */
    if (!borg.temp.smite_evil && !borg.trait[BI_WS_EVIL]
        && borg_spell_fail(SMITE_EVIL, 15)) {
        borg_note("# Casting Smite Evil before leaving level.");
        borg.no_rest_prep = 21000;
        return true;
    }

    /* Cast Venom just before returning to dungeon */
    if (!borg.temp.venom && !borg.trait[BI_WB_POIS]
        && borg_spell_fail(VENOM, 15)) {
        borg_note("# Casting Venom before leaving level.");
        borg.no_rest_prep = 18000;
        return true;
    }

    /* Cast PFE just before returning to dungeon */
    if (!borg.temp.prot_from_evil
        && borg_spell_fail(PROTECTION_FROM_EVIL, 15)) {
        borg_note("# Casting PFE before leaving level.");
        borg.no_rest_prep = borg.trait[BI_CLEVEL] * 1000;
        return true;
    }

    /* Cast bless prep things */
    if ((!borg.temp.bless
            && (borg_spell_fail(BLESS, 15)
                || borg_spell_fail(DEMON_BANE, 15)))) {
        borg_note("# Casting blessing before leaving level.");
        borg.no_rest_prep = 11000;
        return true;
    }
    return false;
}